

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsCreatePromise(JsValueRef *promise,JsValueRef *resolve,JsValueRef *reject)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  JsErrorCode exitStatus;
  JsrtContext *currentContext;
  undefined4 *puVar3;
  JavascriptPromise *promise_00;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  JavascriptPromiseResolveOrRejectFunction *jsResolve;
  JavascriptPromiseResolveOrRejectFunction *jsReject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus == JsNoError) {
    scriptContext =
         (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&jsReject + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
               (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                         ,0x3c6,"(false)","Need to implement support here!!!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    exitStatus = JsErrorNullArgument;
    if (reject != (JsValueRef *)0x0 &&
        (resolve != (JsValueRef *)0x0 && promise != (JsValueRef *)0x0)) {
      *promise = (JsValueRef)0x0;
      *resolve = (JsValueRef)0x0;
      *reject = (JsValueRef)0x0;
      _actionEntryPopper.m_resultPtr = (TTDVar *)0x0;
      jsResolve = (JavascriptPromiseResolveOrRejectFunction *)0x0;
      promise_00 = Js::JavascriptLibrary::CreatePromise
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      Js::JavascriptPromise::InitializePromise
                (promise_00,
                 (JavascriptPromiseResolveOrRejectFunction **)&_actionEntryPopper.m_resultPtr,
                 &jsResolve,scriptContext);
      *promise = promise_00;
      *resolve = _actionEntryPopper.m_resultPtr;
      *reject = jsResolve;
      exitStatus = JsNoError;
    }
    Js::EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&jsReject + 4));
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreatePromise(_Out_ JsValueRef *promise, _Out_ JsValueRef *resolve, _Out_ JsValueRef *reject)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        PARAM_NOT_NULL(promise);
        PARAM_NOT_NULL(resolve);
        PARAM_NOT_NULL(reject);

        *promise = nullptr;
        *resolve = nullptr;
        *reject = nullptr;

        Js::JavascriptPromiseResolveOrRejectFunction *jsResolve = nullptr;
        Js::JavascriptPromiseResolveOrRejectFunction *jsReject = nullptr;
        Js::JavascriptPromise *jsPromise = scriptContext->GetLibrary()->CreatePromise();
        Js::JavascriptPromise::InitializePromise(jsPromise, &jsResolve, &jsReject, scriptContext);

        *promise = (JsValueRef)jsPromise;
        *resolve = (JsValueRef)jsResolve;
        *reject = (JsValueRef)jsReject;

        return JsNoError;
    });
}